

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

_Bool M68K_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                         uint64_t address,void *inst_info)

{
  cs_m68k *op;
  uint8_t uVar1;
  cs_mode cVar2;
  cs_struct *pcVar3;
  m68k_info *info;
  cs_detail *__s;
  _func_void_m68k_info_ptr *p_Var4;
  _Bool _Var5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  MCInst *pMVar11;
  opcode_struct *poVar12;
  uint uVar13;
  uint16_t uVar14;
  cs_m68k_op *op_00;
  ulong uVar15;
  uint uVar16;
  uint *puVar17;
  undefined1 auVar18 [16];
  
  if (code_len < 2) {
    uVar14 = 0;
    _Var5 = false;
  }
  else {
    pcVar3 = instr->csh;
    info = (m68k_info *)pcVar3->printer_info;
    __s = instr->flat_insn->detail;
    pMVar11 = instr;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x148);
    }
    uVar8 = 0;
    info->groups_count = '\0';
    info->regs_read_count = '\0';
    info->regs_write_count = '\0';
    info->code = code;
    info->code_len = code_len;
    info->baseAddress = address;
    cVar2 = pcVar3->mode;
    auVar18._0_4_ = -(uint)((cVar2 & (CS_MODE_M680X_6808|CS_MODE_M680X_6805)) == CS_MODE_ARM);
    auVar18._4_4_ = -(uint)((cVar2 & CS_MODE_M680X_6801) == CS_MODE_ARM);
    auVar18._8_4_ = -(uint)((cVar2 & CS_MODE_64) == CS_MODE_ARM);
    auVar18._12_4_ = -(uint)((cVar2 & CS_MODE_32) == CS_MODE_ARM);
    uVar10 = movmskps((int)pMVar11,auVar18);
    uVar6 = 3;
    if ((uVar10 & 4) != 0) {
      uVar6 = (uint)((uVar10 & 8) == 0);
    }
    uVar13 = 4;
    if ((uVar10 & 2) != 0) {
      uVar13 = uVar6;
    }
    info->inst = instr;
    uVar16 = (uint)address;
    info->pc = uVar16;
    info->ir = 0;
    uVar6 = 5;
    if ((uVar10 & 1) != 0) {
      uVar6 = uVar13;
    }
    uVar10 = *(uint *)(&DAT_0051ac98 + (uVar6 << 2));
    info->type = *(uint *)(&DAT_0051ac80 + (uVar6 << 2));
    info->address_mask = uVar10;
    instr->Opcode = 0;
    op = &info->extension;
    if (g_instruction_table[0].instruction == (_func_void_m68k_info_ptr *)0x0) {
      for (poVar12 = g_opcode_info; poVar12->opcode_handler != (_func_void_m68k_info_ptr *)0x0;
          poVar12 = poVar12 + 1) {
        uVar8 = uVar8 + 1;
      }
      qsort(g_opcode_info,(ulong)uVar8,0x20,compare_nof_true_bits);
      for (uVar15 = 0; uVar15 != 0x10000; uVar15 = uVar15 + 1) {
        g_instruction_table[uVar15].instruction = d68000_invalid;
        for (puVar17 = &g_opcode_info[0].mask2;
            p_Var4 = ((opcode_struct *)(puVar17 + -5))->opcode_handler,
            p_Var4 != (_func_void_m68k_info_ptr *)0x0; puVar17 = puVar17 + 8) {
          if ((((puVar17[-3] & (uint)uVar15) == puVar17[-2]) &&
              ((((p_Var4 != d68000_move_32 && (p_Var4 != d68000_move_8)) &&
                (p_Var4 != d68000_move_16)) ||
               (iVar7 = valid_ea((uint)(uVar15 >> 3) & 0x38 | (uint)(uVar15 >> 9) & 7,0xbf8),
               iVar7 != 0)))) && (iVar7 = valid_ea((uint)uVar15,puVar17[-1]), iVar7 != 0)) {
            g_instruction_table[uVar15].instruction = p_Var4;
            *(undefined8 *)&g_instruction_table[uVar15].word2_mask = *(undefined8 *)puVar17;
            break;
          }
        }
      }
    }
    memset(op,0,0xf0);
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    for (lVar9 = 0x60; lVar9 != 0x140; lVar9 = lVar9 + 0x38) {
      *(undefined4 *)((long)(info->extension).operands + lVar9 + -0x30) = 1;
    }
    uVar6 = peek_imm_16(info);
    info->ir = uVar6;
    uVar6 = peek_imm_32(info);
    iVar7 = instruction_is_valid(info,uVar6 & 0xffff);
    if (iVar7 != 0) {
      uVar6 = read_imm_16(info);
      info->ir = uVar6;
      (*g_instruction_table[uVar6].instruction)(info);
    }
    uVar6 = info->pc;
    info->pc = uVar16;
    iVar7 = uVar6 - uVar16;
    if (iVar7 == 0) {
      _Var5 = false;
      uVar14 = 2;
    }
    else {
      uVar1 = (info->extension).op_count;
      if (uVar1 != '\0') {
        if (uVar1 == '\x01') {
          update_op_reg_list(info,op->operands,1);
        }
        else {
          update_op_reg_list(info,op->operands,0);
          op_00 = (info->extension).operands;
          for (uVar15 = 1; op_00 = op_00 + 1, uVar15 < (info->extension).op_count;
              uVar15 = uVar15 + 1) {
            update_op_reg_list(info,op_00,1);
          }
        }
      }
      uVar14 = (uint16_t)iVar7;
      if ((int)code_len < iVar7) {
        uVar14 = (uint16_t)code_len;
      }
      _Var5 = true;
    }
  }
  *size = uVar14;
  return _Var5;
}

Assistant:

bool M68K_getInstruction(csh ud, const uint8_t* code, size_t code_len, MCInst* instr, uint16_t* size, uint64_t address, void* inst_info)
{
#ifdef M68K_DEBUG
	SStream ss;
#endif
	int s;
	int cpu_type = M68K_CPU_TYPE_68000;
	cs_struct* handle = instr->csh;
	m68k_info *info = (m68k_info*)handle->printer_info;

	// code len has to be at least 2 bytes to be valid m68k

	if (code_len < 2) {
		*size = 0;
		return false;
	}

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, offsetof(cs_detail, m68k)+sizeof(cs_m68k));
	}

	info->groups_count = 0;
	info->regs_read_count = 0;
	info->regs_write_count = 0;
	info->code = code;
	info->code_len = code_len;
	info->baseAddress = address;

	if (handle->mode & CS_MODE_M68K_010)
		cpu_type = M68K_CPU_TYPE_68010;
	if (handle->mode & CS_MODE_M68K_020)
		cpu_type = M68K_CPU_TYPE_68020;
	if (handle->mode & CS_MODE_M68K_030)
		cpu_type = M68K_CPU_TYPE_68030;
	if (handle->mode & CS_MODE_M68K_040)
		cpu_type = M68K_CPU_TYPE_68040;
	if (handle->mode & CS_MODE_M68K_060)
		cpu_type = M68K_CPU_TYPE_68040;	// 060 = 040 for now

	m68k_setup_internals(info, instr, (unsigned int)address, cpu_type);
	s = m68k_disassemble(info, address);

	if (s == 0) {
		*size = 2;
		return false;
	}

	build_regs_read_write_counts(info);

#ifdef M68K_DEBUG
	SStream_Init(&ss);
	M68K_printInst(instr, &ss, info);
#endif

	// Make sure we always stay within range
	if (s > (int)code_len)
		*size = (uint16_t)code_len;
	else
		*size = (uint16_t)s;

	return true;
}